

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenFaceNormalsProcess.cpp
# Opt level: O0

void __thiscall Assimp::GenFaceNormalsProcess::Execute(GenFaceNormalsProcess *this,aiScene *pScene)

{
  bool bVar1;
  bool bVar2;
  Logger *pLVar3;
  DeadlyImportError *this_00;
  uint local_54;
  uint a;
  bool bHas;
  allocator local_39;
  string local_38;
  aiScene *local_18;
  aiScene *pScene_local;
  GenFaceNormalsProcess *this_local;
  
  local_18 = pScene;
  pScene_local = (aiScene *)this;
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"GenFaceNormalsProcess begin");
  if ((local_18->mFlags & 8) == 0) {
    bVar1 = false;
    for (local_54 = 0; local_54 < local_18->mNumMeshes; local_54 = local_54 + 1) {
      bVar2 = GenMeshFaceNormals(this,local_18->mMeshes[local_54]);
      if (bVar2) {
        bVar1 = true;
      }
    }
    if (bVar1) {
      pLVar3 = DefaultLogger::get();
      Logger::info(pLVar3,"GenFaceNormalsProcess finished. Face normals have been calculated");
    }
    else {
      pLVar3 = DefaultLogger::get();
      Logger::debug(pLVar3,"GenFaceNormalsProcess finished. Normals are already there");
    }
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_38,
             "Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here",
             &local_39);
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void GenFaceNormalsProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("GenFaceNormalsProcess begin");

    if (pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT) {
        throw DeadlyImportError("Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here");
    }

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)   {
        if(this->GenMeshFaceNormals( pScene->mMeshes[a])) {
            bHas = true;
        }
    }
    if (bHas)   {
        ASSIMP_LOG_INFO("GenFaceNormalsProcess finished. "
            "Face normals have been calculated");
    } else {
        ASSIMP_LOG_DEBUG("GenFaceNormalsProcess finished. "
            "Normals are already there");
    }
}